

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteDropCollection(unqlite_col *pCol)

{
  unqlite_vm *puVar1;
  int local_2c;
  sxu32 iBucket;
  int rc;
  jx9_int64 nId;
  unqlite_vm *pVm;
  unqlite_col *pCol_local;
  
  puVar1 = pCol->pVm;
  unqlite_kv_cursor_reset(pCol->pCursor);
  local_2c = unqlite_kv_cursor_seek(pCol->pCursor,(pCol->sName).zString,(pCol->sName).nByte,1);
  if (local_2c == 0) {
    local_2c = unqlite_kv_cursor_delete_entry(pCol->pCursor);
  }
  if (local_2c == 0) {
    for (_iBucket = 0; _iBucket < pCol->nLastid; _iBucket = _iBucket + 1) {
      unqliteCollectionDropRecord(pCol,_iBucket,0,0);
    }
    CollectionCacheRelease(pCol);
    SyBlobRelease(&pCol->sHeader);
    SyBlobRelease(&pCol->sWorker);
    SyMemBackendFree(&puVar1->sAlloc,(pCol->sName).zString);
    unqliteReleaseCursor(puVar1->pDb,pCol->pCursor);
    if (pCol->pPrevCol == (unqlite_col *)0x0) {
      puVar1->apCol[pCol->nHash & puVar1->iColSize - 1] = pCol->pNextCol;
    }
    else {
      pCol->pPrevCol->pNextCol = pCol->pNextCol;
    }
    if (pCol->pNextCol != (unqlite_col *)0x0) {
      pCol->pNextCol->pPrevCol = pCol->pPrevCol;
    }
    if (puVar1->pCol == pCol) {
      puVar1->pCol = puVar1->pCol->pNext;
    }
    if (pCol->pPrev != (unqlite_col *)0x0) {
      pCol->pPrev->pNext = pCol->pNext;
    }
    if (pCol->pNext != (unqlite_col *)0x0) {
      pCol->pNext->pPrev = pCol->pPrev;
    }
    puVar1->iCol = puVar1->iCol - 1;
    SyMemBackendPoolFree(&puVar1->sAlloc,pCol);
    pCol_local._4_4_ = 0;
  }
  else {
    unqliteGenErrorFormat
              (pCol->pVm->pDb,
               "Cannot remove collection \'%z\' due to a read-only Key/Value storage engine",
               &pCol->sName);
    pCol_local._4_4_ = local_2c;
  }
  return pCol_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE int unqliteDropCollection(unqlite_col *pCol)
{
	unqlite_vm *pVm = pCol->pVm;
	jx9_int64 nId;
	int rc;
	/* Reset the cursor */
	unqlite_kv_cursor_reset(pCol->pCursor);
	/* Seek the cursor to the desired location */
	rc = unqlite_kv_cursor_seek(pCol->pCursor,
		SyStringData(&pCol->sName),SyStringLength(&pCol->sName),
		UNQLITE_CURSOR_MATCH_EXACT
		);
	if( rc == UNQLITE_OK ){
		/* Remove the record from the storage engine */
		rc = unqlite_kv_cursor_delete_entry(pCol->pCursor);
	}
	if( rc != UNQLITE_OK ){
		unqliteGenErrorFormat(pCol->pVm->pDb,
				"Cannot remove collection '%z' due to a read-only Key/Value storage engine",
				&pCol->sName
			);
		return rc;
	}
	/* Drop collection records */
	for( nId = 0 ; nId < pCol->nLastid ; ++nId ){
		unqliteCollectionDropRecord(pCol,nId,0,0);
	}
	/* Cleanup */
	CollectionCacheRelease(pCol);
	SyBlobRelease(&pCol->sHeader);
	SyBlobRelease(&pCol->sWorker);
	SyMemBackendFree(&pVm->sAlloc,(void *)SyStringData(&pCol->sName));
	unqliteReleaseCursor(pVm->pDb,pCol->pCursor);
	/* Unlink */
	if( pCol->pPrevCol ){
		pCol->pPrevCol->pNextCol = pCol->pNextCol;
	}else{
		sxu32 iBucket = pCol->nHash & (pVm->iColSize - 1);
		pVm->apCol[iBucket] = pCol->pNextCol;
	}
	if( pCol->pNextCol ){
		pCol->pNextCol->pPrevCol = pCol->pPrevCol;
	}
	MACRO_LD_REMOVE(pVm->pCol,pCol);
	pVm->iCol--;
	SyMemBackendPoolFree(&pVm->sAlloc,pCol);
	return UNQLITE_OK;
}